

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtConvexInternalShape.h
# Opt level: O2

char * __thiscall
cbtConvexInternalShape::serialize
          (cbtConvexInternalShape *this,void *dataBuffer,cbtSerializer *serializer)

{
  cbtCollisionShape::serialize((cbtCollisionShape *)this,dataBuffer,serializer);
  cbtVector3::serializeFloat
            (&this->m_implicitShapeDimensions,(cbtVector3FloatData *)((long)dataBuffer + 0x20));
  cbtVector3::serializeFloat
            ((cbtVector3 *)&(this->super_cbtConvexShape).super_cbtCollisionShape.field_0x1c,
             (cbtVector3FloatData *)((long)dataBuffer + 0x10));
  *(cbtScalar *)((long)dataBuffer + 0x30) = this->m_collisionMargin;
  *(undefined4 *)((long)dataBuffer + 0x34) = 0;
  return "cbtConvexInternalShapeData";
}

Assistant:

SIMD_FORCE_INLINE const char* cbtConvexInternalShape::serialize(void* dataBuffer, cbtSerializer* serializer) const
{
	cbtConvexInternalShapeData* shapeData = (cbtConvexInternalShapeData*)dataBuffer;
	cbtCollisionShape::serialize(&shapeData->m_collisionShapeData, serializer);

	m_implicitShapeDimensions.serializeFloat(shapeData->m_implicitShapeDimensions);
	m_localScaling.serializeFloat(shapeData->m_localScaling);
	shapeData->m_collisionMargin = float(m_collisionMargin);

	// Fill padding with zeros to appease msan.
	shapeData->m_padding = 0;

	return "cbtConvexInternalShapeData";
}